

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl>::operator=
          (RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl> *this,
          ShaderResourceBindingGLImpl *pObj)

{
  RefCountedObject<Diligent::IShaderResourceBindingGL> *this_00;
  
  this_00 = (RefCountedObject<Diligent::IShaderResourceBindingGL> *)this->m_pObject;
  if (this_00 != (RefCountedObject<Diligent::IShaderResourceBindingGL> *)pObj) {
    if (this_00 != (RefCountedObject<Diligent::IShaderResourceBindingGL> *)0x0) {
      RefCountedObject<Diligent::IShaderResourceBindingGL>::Release(this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (ShaderResourceBindingGLImpl *)0x0) {
      RefCountedObject<Diligent::IShaderResourceBindingGL>::AddRef
                ((RefCountedObject<Diligent::IShaderResourceBindingGL> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }